

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

SUNErrCode
N_VLinearSumVectorArray_ManyVector
          (int nvec,sunrealtype a,N_Vector *X,sunrealtype b,N_Vector *Y,N_Vector *Z)

{
  size_t __size;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)nvec;
  __size = lVar2 * 8;
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  __ptr_01 = malloc(__size);
  lVar3 = 0;
  if (lVar2 < 1) {
    lVar2 = lVar3;
  }
  for (; lVar3 < *(*X)->content; lVar3 = lVar3 + 1) {
    for (lVar1 = 0; lVar2 != lVar1; lVar1 = lVar1 + 1) {
      *(undefined8 *)((long)__ptr + lVar1 * 8) =
           *(undefined8 *)(*(long *)((long)X[lVar1]->content + 0x10) + lVar3 * 8);
      *(undefined8 *)((long)__ptr_00 + lVar1 * 8) =
           *(undefined8 *)(*(long *)((long)Y[lVar1]->content + 0x10) + lVar3 * 8);
      *(undefined8 *)((long)__ptr_01 + lVar1 * 8) =
           *(undefined8 *)(*(long *)((long)Z[lVar1]->content + 0x10) + lVar3 * 8);
    }
    N_VLinearSumVectorArray(a,b,nvec,__ptr,__ptr_00,__ptr_01);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VLinearSumVectorArray)(int nvec, sunrealtype a,
                                             N_Vector* X, sunrealtype b,
                                             N_Vector* Y, N_Vector* Z)
{
  SUNFunctionBegin(X[0]->sunctx);
  sunindextype i, j;
  N_Vector *Xsub, *Ysub, *Zsub;

  SUNAssert(nvec > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* create arrays of nvec N_Vector pointers for reuse within loop */
  Xsub = NULL;
  Ysub = NULL;
  Zsub = NULL;
  Xsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Xsub, SUN_ERR_MALLOC_FAIL);
  Ysub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Ysub, SUN_ERR_MALLOC_FAIL);
  Zsub = (N_Vector*)malloc(nvec * sizeof(N_Vector));
  SUNAssert(Zsub, SUN_ERR_MALLOC_FAIL);

  /* perform operation by calling N_VLinearSumVectorArray for each subvector */
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(X[0]); i++)
  {
    /* for each subvector, create the array of subvectors of X, Y and Z */
    for (j = 0; j < nvec; j++)
    {
      Xsub[j] = MANYVECTOR_SUBVEC(X[j], i);
      Ysub[j] = MANYVECTOR_SUBVEC(Y[j], i);
      Zsub[j] = MANYVECTOR_SUBVEC(Z[j], i);
    }

    /* now call N_VLinearSumVectorArray for this array of subvectors */
    SUNCheckCall(N_VLinearSumVectorArray(nvec, a, Xsub, b, Ysub, Zsub));
  }

  /* clean up and return */
  free(Xsub);
  free(Ysub);
  free(Zsub);
  return SUN_SUCCESS;
}